

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPM2B_IV_Unmarshal(TPM2B_IV *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  BYTE *pBVar2;
  UINT16 UVar3;
  TPM_RC TVar4;
  uint uVar5;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar4 = 0x9a;
  if (1 < iVar1) {
    UVar3 = ByteArrayToUint16(*buffer);
    (target->t).size = UVar3;
    pBVar2 = *buffer;
    *buffer = pBVar2 + 2;
    TVar4 = 0x95;
    if ((target->t).size < 0x11) {
      TVar4 = 0x9a;
      uVar5 = (uint)(target->t).size;
      if ((int)uVar5 <= *size) {
        memcpy((target->t).buffer,pBVar2 + 2,(ulong)uVar5);
        *size = *size - uVar5;
        *buffer = *buffer + uVar5;
        TVar4 = 0;
      }
    }
  }
  return TVar4;
}

Assistant:

TPM_RC UINT16_Unmarshal(UINT16 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 2) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT16(*buffer);
        *buffer += 2;
        result = TPM_RC_SUCCESS;
    }
    return result;
}